

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int run_test_spawn_ignored_stdio(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_timer_t *puVar3;
  int extraout_EDX;
  uv_process_t *puVar4;
  uv_timer_t *puVar5;
  code *pcVar6;
  char *pcVar7;
  
  init_process_options("spawn_helper6",exit_cb);
  options.stdio = (uv_stdio_container_t *)0x0;
  options.stdio_count = 0;
  uVar2 = uv_default_loop();
  iVar1 = uv_spawn(uVar2,&process,&options);
  if (iVar1 == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_0016d65c;
    if (exit_cb_called != 1) goto LAB_0016d661;
    if (close_cb_called != 1) goto LAB_0016d666;
    uVar2 = uv_default_loop();
    uv_walk(uVar2,close_walk_cb,0);
    uv_run(uVar2,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_spawn_ignored_stdio_cold_1();
LAB_0016d65c:
    run_test_spawn_ignored_stdio_cold_2();
LAB_0016d661:
    run_test_spawn_ignored_stdio_cold_3();
LAB_0016d666:
    run_test_spawn_ignored_stdio_cold_4();
  }
  run_test_spawn_ignored_stdio_cold_5();
  init_process_options("spawn_helper4",kill_cb);
  puVar3 = (uv_timer_t *)uv_default_loop();
  puVar4 = &process;
  iVar1 = uv_spawn(puVar3,&process,&options);
  if (iVar1 == 0) {
    puVar3 = (uv_timer_t *)uv_default_loop();
    puVar5 = &timer;
    iVar1 = uv_timer_init();
    pcVar6 = (code *)puVar5;
    if (iVar1 != 0) goto LAB_0016d743;
    puVar3 = &timer;
    pcVar6 = timer_cb;
    iVar1 = uv_timer_start(&timer,timer_cb,500,0);
    if (iVar1 != 0) goto LAB_0016d748;
    puVar3 = (uv_timer_t *)uv_default_loop();
    pcVar6 = (code *)0x0;
    iVar1 = uv_run();
    if (iVar1 != 0) goto LAB_0016d74d;
    if (exit_cb_called != 1) goto LAB_0016d752;
    if (close_cb_called != 2) goto LAB_0016d757;
    uVar2 = uv_default_loop();
    uv_walk(uVar2,close_walk_cb,0);
    pcVar6 = (code *)0x0;
    uv_run(uVar2);
    puVar3 = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_spawn_and_kill_cold_1();
    pcVar6 = (code *)puVar4;
LAB_0016d743:
    run_test_spawn_and_kill_cold_2();
LAB_0016d748:
    run_test_spawn_and_kill_cold_3();
LAB_0016d74d:
    run_test_spawn_and_kill_cold_4();
LAB_0016d752:
    run_test_spawn_and_kill_cold_5();
LAB_0016d757:
    run_test_spawn_and_kill_cold_6();
  }
  run_test_spawn_and_kill_cold_7();
  pcVar7 = "exit_cb";
  puts("exit_cb");
  exit_cb_called = exit_cb_called + 1;
  if ((uv_timer_t *)pcVar6 == (uv_timer_t *)0x0) {
    if (extraout_EDX == 0xf) {
      uv_close(puVar3,close_cb);
      pcVar7 = (char *)(ulong)*(uint *)puVar3->heap_node;
      iVar1 = uv_kill(pcVar7,0);
      if (iVar1 == -3) {
        return iVar1;
      }
      goto LAB_0016d7b6;
    }
  }
  else {
    kill_cb_cold_1();
  }
  kill_cb_cold_2();
LAB_0016d7b6:
  kill_cb_cold_3();
  uv_process_kill(&process,0xf);
  iVar1 = uv_close(pcVar7,close_cb);
  return iVar1;
}

Assistant:

TEST_IMPL(spawn_ignored_stdio) {
  int r;

  init_process_options("spawn_helper6", exit_cb);

  options.stdio = NULL;
  options.stdio_count = 0;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}